

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamcharsource.h
# Opt level: O2

StreamCharSource __thiscall YAML::StreamCharSource::operator+(StreamCharSource *this,int i)

{
  size_t sVar1;
  StreamCharSource SVar2;
  
  sVar1 = 0;
  if (-1 < i + (int)this->m_offset) {
    sVar1 = this->m_offset + (long)i;
  }
  SVar2.m_stream = this->m_stream;
  SVar2.m_offset = sVar1;
  return SVar2;
}

Assistant:

inline const StreamCharSource StreamCharSource::operator+(int i) const {
  StreamCharSource source(*this);
  if (static_cast<int>(source.m_offset) + i >= 0)
    source.m_offset += static_cast<std::size_t>(i);
  else
    source.m_offset = 0;
  return source;
}